

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void run_file(char *file_name)

{
  InterpretResult IVar1;
  char *source_00;
  InterpretResult result;
  char *source;
  Vm vm;
  char *file_name_local;
  
  vm._8448_8_ = file_name;
  vm_init((Vm *)&source,false);
  source_00 = read_file((char *)vm._8448_8_);
  IVar1 = interpret((Vm *)&source,source_00);
  vm_free((Vm *)&source);
  free(source_00);
  if (IVar1 == INTERPRET_RUNTIME_ERROR) {
    printf("Error while interpreting %s\n",vm._8448_8_);
    exit(0x2a);
  }
  if (IVar1 == INTERPRET_COMPILE_ERROR) {
    printf("Error while compiling %s\n",vm._8448_8_);
    exit(0x2b);
  }
  return;
}

Assistant:

static void run_file(const char *file_name) {
    Vm vm;
    vm_init(&vm, false);

    char *source = read_file(file_name);
    InterpretResult result = interpret(&vm, source);

    vm_free(&vm);
    free(source);

    if (result == INTERPRET_RUNTIME_ERROR) {
        printf("Error while interpreting %s\n", file_name);
        exit(42);
    }
    if (result == INTERPRET_COMPILE_ERROR) {
        printf("Error while compiling %s\n", file_name);
        exit(43);
    }
}